

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolData.cpp
# Opt level: O2

void __thiscall SymbolData::writeNocashSym(SymbolData *this)

{
  undefined1 *this_00;
  pointer pSVar1;
  long *plVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  long *plVar8;
  _Base_ptr p_Var9;
  char *fmt;
  ulong uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  unsigned_long *in_R8;
  size_t i;
  __filebuf_type *p_Var11;
  ulong uVar12;
  size_t size;
  vector<NocashSymEntry,_std::allocator<NocashSymEntry>_> entries;
  string local_318;
  TextFile file;
  
  bVar5 = ghc::filesystem::path::empty(&this->nocashSymFileName);
  if (!bVar5) {
    entries.super__Vector_base<NocashSymEntry,_std::allocator<NocashSymEntry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    entries.super__Vector_base<NocashSymEntry,_std::allocator<NocashSymEntry>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    entries.super__Vector_base<NocashSymEntry,_std::allocator<NocashSymEntry>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    this_00 = &file.stream.super_basic_fstream<char,_std::char_traits<char>_>.field_0x8;
    uVar10 = 0;
    while( true ) {
      pSVar1 = (this->modules).super__Vector_base<SymDataModule,_std::allocator<SymDataModule>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar7 = (long)(this->modules).
                    super__Vector_base<SymDataModule,_std::allocator<SymDataModule>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pSVar1;
      if ((ulong)(lVar7 / 0x68) <= uVar10) break;
      uVar12 = 0;
      while( true ) {
        p_Var11 = &file.stream.super_basic_fstream<char,_std::char_traits<char>_>._M_filebuf;
        lVar7 = *(long *)&pSVar1[uVar10].symbols.
                          super__Vector_base<SymDataSymbol,_std::allocator<SymDataSymbol>_>._M_impl.
                          super__Vector_impl_data;
        if ((ulong)(((long)*(pointer *)
                            ((long)&pSVar1[uVar10].symbols.
                                    super__Vector_base<SymDataSymbol,_std::allocator<SymDataSymbol>_>
                                    ._M_impl + 8) - lVar7) / 0x28) <= uVar12) break;
        fmt = (char *)(lVar7 + uVar12 * 0x28);
        size = 0;
        plVar2 = *(long **)&pSVar1[uVar10].functions.
                            super__Vector_base<SymDataFunction,_std::allocator<SymDataFunction>_>.
                            _M_impl.super__Vector_impl_data;
        lVar7 = ((long)*(pointer *)
                        ((long)&pSVar1[uVar10].functions.
                                super__Vector_base<SymDataFunction,_std::allocator<SymDataFunction>_>
                                ._M_impl + 8) - (long)plVar2 >> 4) + 1;
        do {
          plVar8 = plVar2;
          lVar7 = lVar7 + -1;
          if (lVar7 == 0) {
            bVar5 = false;
            goto LAB_0013a657;
          }
          plVar2 = plVar8 + 2;
        } while (*plVar8 != *(long *)(fmt + 0x20));
        size = plVar8[1];
        bVar5 = size != 0;
LAB_0013a657:
        file.stream.super_basic_fstream<char,_std::char_traits<char>_>._16_8_ = 0;
        file.stream.super_basic_fstream<char,_std::char_traits<char>_>._M_filebuf =
             (__filebuf_type)0x0;
        file.stream.super_basic_fstream<char,_std::char_traits<char>_>._0_1_ = fmt[0x20];
        file.stream.super_basic_fstream<char,_std::char_traits<char>_>._1_1_ = fmt[0x21];
        file.stream.super_basic_fstream<char,_std::char_traits<char>_>._2_1_ = fmt[0x22];
        file.stream.super_basic_fstream<char,_std::char_traits<char>_>._3_1_ = fmt[0x23];
        file.stream.super_basic_fstream<char,_std::char_traits<char>_>._4_1_ = fmt[0x24];
        file.stream.super_basic_fstream<char,_std::char_traits<char>_>._5_1_ = fmt[0x25];
        file.stream.super_basic_fstream<char,_std::char_traits<char>_>._6_1_ = fmt[0x26];
        file.stream.super_basic_fstream<char,_std::char_traits<char>_>._7_1_ = fmt[0x27];
        if ((bVar5) && (1 < this->nocashSymVersion)) {
          file.stream.super_basic_fstream<char,_std::char_traits<char>_>._8_8_ = p_Var11;
          tinyformat::format<std::__cxx11::string,unsigned_long>
                    (&local_318,(tinyformat *)"%s,%08X",fmt,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&size,
                     in_R8);
          std::__cxx11::string::operator=((string *)this_00,(string *)&local_318);
          std::__cxx11::string::~string((string *)&local_318);
        }
        else {
          file.stream.super_basic_fstream<char,_std::char_traits<char>_>._8_8_ = p_Var11;
          std::__cxx11::string::_M_assign((string *)this_00);
        }
        uVar4 = file.stream.super_basic_fstream<char,_std::char_traits<char>_>._16_8_;
        uVar3 = file.stream.super_basic_fstream<char,_std::char_traits<char>_>._8_8_;
        if (this->nocashSymVersion == 1) {
          for (lVar7 = 0; uVar4 != lVar7; lVar7 = lVar7 + 1) {
            iVar6 = tolower((int)*(char *)(uVar3 + lVar7));
            *(char *)(uVar3 + lVar7) = (char)iVar6;
          }
        }
        std::vector<NocashSymEntry,_std::allocator<NocashSymEntry>_>::push_back
                  (&entries,(value_type *)&file);
        std::__cxx11::string::~string((string *)this_00);
        uVar12 = uVar12 + 1;
      }
      for (p_Var9 = *(_Base_ptr *)((long)&pSVar1[uVar10].data._M_t._M_impl + 0x18);
          p_Var9 != (_Rb_tree_node_base *)((long)&pSVar1[uVar10].data._M_t._M_impl + 8U);
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
        file.stream.super_basic_fstream<char,_std::char_traits<char>_>._16_8_ = 0;
        file.stream.super_basic_fstream<char,_std::char_traits<char>_>._M_filebuf =
             (__filebuf_type)0x0;
        file.stream.super_basic_fstream<char,_std::char_traits<char>_>._0_4_ = p_Var9[1]._M_color;
        file.stream.super_basic_fstream<char,_std::char_traits<char>_>._4_4_ =
             *(undefined4 *)&p_Var9[1].field_0x4;
        file.stream.super_basic_fstream<char,_std::char_traits<char>_>._8_8_ = p_Var11;
        switch(*(undefined4 *)&p_Var9[1]._M_left) {
        case 0:
          tinyformat::format<unsigned_long>
                    (&local_318,".byt:%04X",(unsigned_long *)&p_Var9[1]._M_parent);
          break;
        case 1:
          tinyformat::format<unsigned_long>
                    (&local_318,".wrd:%04X",(unsigned_long *)&p_Var9[1]._M_parent);
          break;
        case 2:
          tinyformat::format<unsigned_long>
                    (&local_318,".dbl:%04X",(unsigned_long *)&p_Var9[1]._M_parent);
          break;
        case 3:
          tinyformat::format<unsigned_long>
                    (&local_318,".dbl:%04X",(unsigned_long *)&p_Var9[1]._M_parent);
          break;
        case 4:
          tinyformat::format<unsigned_long>
                    (&local_318,".asc:%04X",(unsigned_long *)&p_Var9[1]._M_parent);
          break;
        default:
          goto switchD_0013a764_default;
        }
        std::__cxx11::string::operator=
                  ((string *)
                   &file.stream.super_basic_fstream<char,_std::char_traits<char>_>.field_0x8,
                   (string *)&local_318);
        std::__cxx11::string::~string((string *)&local_318);
switchD_0013a764_default:
        std::vector<NocashSymEntry,_std::allocator<NocashSymEntry>_>::push_back
                  (&entries,(value_type *)&file);
        std::__cxx11::string::~string
                  ((string *)
                   &file.stream.super_basic_fstream<char,_std::char_traits<char>_>.field_0x8);
      }
      uVar10 = uVar10 + 1;
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<NocashSymEntry*,std::vector<NocashSymEntry,std::allocator<NocashSymEntry>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (entries.super__Vector_base<NocashSymEntry,_std::allocator<NocashSymEntry>_>._M_impl.
               super__Vector_impl_data._M_start,
               entries.super__Vector_base<NocashSymEntry,_std::allocator<NocashSymEntry>_>._M_impl.
               super__Vector_impl_data._M_finish,lVar7 % 0x68);
    TextFile::TextFile(&file);
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    iVar6 = TextFile::open(&file,(char *)this,1);
    if ((char)iVar6 == '\0') {
      ghc::filesystem::path::u8string_abi_cxx11_(&local_318,&file.fileName);
      Logger::printError<std::__cxx11::string>((Logger *)0x1,0x177938,(char *)&local_318,args);
      std::__cxx11::string::~string((string *)&local_318);
    }
    else {
      TextFile::writeLine(&file,"00000000 0");
      lVar7 = 8;
      for (uVar10 = 0;
          uVar10 < (ulong)(((long)entries.
                                  super__Vector_base<NocashSymEntry,_std::allocator<NocashSymEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)entries.
                                 super__Vector_base<NocashSymEntry,_std::allocator<NocashSymEntry>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x28);
          uVar10 = uVar10 + 1) {
        TextFile::writeFormat<long,std::__cxx11::string>
                  (&file,"%08X %s\n",
                   (long *)((long)entries.
                                  super__Vector_base<NocashSymEntry,_std::allocator<NocashSymEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar7 + -8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(entries.
                            super__Vector_base<NocashSymEntry,_std::allocator<NocashSymEntry>_>.
                            _M_impl.super__Vector_impl_data._M_start)->address + lVar7));
        lVar7 = lVar7 + 0x28;
      }
      iVar6 = 0x177968;
      TextFile::write(&file,0x177968,
                      (void *)(((long)entries.
                                      super__Vector_base<NocashSymEntry,_std::allocator<NocashSymEntry>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)entries.
                                     super__Vector_base<NocashSymEntry,_std::allocator<NocashSymEntry>_>
                                     ._M_impl.super__Vector_impl_data._M_start) % 0x28),
                      (size_t)entries.
                              super__Vector_base<NocashSymEntry,_std::allocator<NocashSymEntry>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      TextFile::close(&file,iVar6);
    }
    TextFile::~TextFile(&file);
    std::vector<NocashSymEntry,_std::allocator<NocashSymEntry>_>::~vector(&entries);
  }
  return;
}

Assistant:

void SymbolData::writeNocashSym()
{
	if (nocashSymFileName.empty())
		return;

	std::vector<NocashSymEntry> entries;
	for (size_t k = 0; k < modules.size(); k++)
	{
		SymDataModule& module = modules[k];
		for (size_t i = 0; i < module.symbols.size(); i++)
		{
			SymDataSymbol& sym = module.symbols[i];
			
			size_t size = 0;
			for (size_t f = 0; f < module.functions.size(); f++)
			{
				if (module.functions[f].address == sym.address)
				{
					size = module.functions[f].size;
					break;
				}
			}

			NocashSymEntry entry;
			entry.address = sym.address;

			if (size != 0 && nocashSymVersion >= 2)
				entry.text = tfm::format("%s,%08X",sym.name,size);
			else
				entry.text = sym.name;

			if (nocashSymVersion == 1)
				std::transform(entry.text.begin(), entry.text.end(), entry.text.begin(), ::tolower);

			entries.push_back(entry);
		}

		for (const SymDataData& data: module.data)
		{
			NocashSymEntry entry;
			entry.address = data.address;

			switch (data.type)
			{
			case Data8:
				entry.text = tfm::format(".byt:%04X",data.size);
				break;
			case Data16:
				entry.text = tfm::format(".wrd:%04X",data.size);
				break;
			case Data32:
				entry.text = tfm::format(".dbl:%04X",data.size);
				break;
			case Data64:
				entry.text = tfm::format(".dbl:%04X",data.size);
				break;
			case DataAscii:
				entry.text = tfm::format(".asc:%04X",data.size);
				break;
			}

			entries.push_back(entry);
		}
	}

	std::sort(entries.begin(),entries.end());
	
	TextFile file;
	if (!file.open(nocashSymFileName,TextFile::Write,TextFile::ASCII))
	{
		Logger::printError(Logger::Error, "Could not open sym file %s.",file.getFileName().u8string());
		return;
	}
	file.writeLine("00000000 0");

	for (size_t i = 0; i < entries.size(); i++)
	{
		file.writeFormat("%08X %s\n",entries[i].address,entries[i].text);
	}

	file.write("\x1A");
	file.close();
}